

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int set_parameters_from_string(char **file_content,char *name)

{
  size_t sVar1;
  uint uVar2;
  uint uVar3;
  int (*paaiVar4) [5] [5];
  int iVar5;
  parset pVar6;
  size_t sVar7;
  char *in_RCX;
  int (*paaiVar8) [5] [5];
  int (*paiVar9) [5];
  int (*array) [8] [5] [5] [5];
  int (*paaaiVar10) [8] [5] [5];
  int m_1;
  int *piVar11;
  int (*paaaiVar12) [8] [5] [5];
  int *in_R8;
  int *in_R9;
  int m;
  int *piVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  int (*paaaaaiVar19) [8] [5] [5] [5] [5];
  int n;
  int (*paiVar20) [8];
  ulong uVar21;
  int n_1;
  int (*paiVar22) [8];
  ulong uVar23;
  int (*paaaaaiVar24) [8] [5] [5] [5] [5];
  size_t line_no;
  int values [6];
  char ident [256];
  size_t local_1c0;
  int (*local_1b8) [5];
  int (*local_1b0) [5] [5];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int local_198;
  int local_194;
  int (*local_188) [5] [5];
  int (*local_180) [5];
  int (*local_178) [5] [5];
  int (*local_170) [5];
  int (*local_168) [5] [5];
  int (*local_160) [5];
  int (*local_158) [5] [5];
  int (*local_150) [5] [5];
  int (*local_148) [5] [5];
  long local_140;
  char local_138 [264];
  
  iVar5 = 0;
  if ((file_content != (char **)0x0) && (iVar5 = 0, *file_content != (char *)0x0)) {
    free(last_param_file);
    if (name == (char *)0x0) {
      last_param_file = (char *)0x0;
    }
    else {
      last_param_file = strdup(name);
    }
    iVar5 = strncmp(*file_content,"## RNAfold parameter file v2.0",0x1e);
    if (iVar5 != 0) {
      vrna_message_warning
                (
                "Missing header line in file.\nMay be this file has not v2.0 format.\nUse INTERRUPT-key to stop."
                );
    }
    local_1c0 = 2;
    pcVar16 = file_content[1];
    paaiVar4 = (int (*) [5] [5])file_content;
    sVar1 = local_1c0;
    paaiVar8 = local_1b0;
    while (local_1b0 = paaiVar4, local_1c0 = sVar1, pcVar16 != (char *)0x0) {
      iVar5 = __isoc99_sscanf(pcVar16,"# %255s",local_138);
      if (iVar5 != 1) goto switchD_00124f6e_caseD_0;
      pVar6 = gettype(local_138);
      switch(pVar6) {
      case QUIT:
        goto switchD_00124f6e_caseD_0;
      case S:
        paiVar9 = (int (*) [5])stack37;
        goto LAB_00124f98;
      case S_H:
        paiVar9 = (int (*) [5])stackdH;
LAB_00124f98:
        in_R8 = stack_shift;
        in_RCX = (char *)stack_dim;
        goto LAB_001251eb;
      case HP:
        piVar11 = hairpin37;
        goto LAB_00124fdf;
      case HP_H:
        piVar11 = hairpindH;
        goto LAB_00124fdf;
      case B:
        piVar11 = bulge37;
        goto LAB_00124fdf;
      case B_H:
        piVar11 = bulgedH;
        goto LAB_00124fdf;
      case IL:
        piVar11 = internal_loop37;
        goto LAB_00124fdf;
      case IL_H:
        piVar11 = internal_loopdH;
LAB_00124fdf:
        in_RCX = (char *)0x1f;
        in_R8 = (int *)0x0;
        in_R9 = (int *)0x0;
        rd_1dim_slice(file_content,&local_1c0,piVar11,0x1f,0,0);
        goto switchD_00124f6e_caseD_0;
      case MMH:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatchH37;
        break;
      case MMH_H:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatchHdH;
        break;
      case MMI:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatchI37;
        break;
      case MMI_H:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatchIdH;
        break;
      case MMI1N:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatch1nI37;
        break;
      case MMI1N_H:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatch1nIdH;
        break;
      case MMI23:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatch23I37;
        break;
      case MMI23_H:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatch23IdH;
        break;
      case MMM:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatchM37;
        break;
      case MMM_H:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatchMdH;
        break;
      case MME:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatchExt37;
        break;
      case MME_H:
        uStack_1a0 = (ulong)uStack_1a0._4_4_ << 0x20;
        paaiVar8 = mismatchExtdH;
        break;
      case D5:
        paiVar9 = dangle5_37;
        goto LAB_001251dd;
      case D5_H:
        paiVar9 = dangle5_dH;
        goto LAB_001251dd;
      case D3:
        paiVar9 = dangle3_37;
        goto LAB_001251dd;
      case D3_H:
        paiVar9 = dangle3_dH;
LAB_001251dd:
        in_R8 = dangle_shift;
        in_RCX = (char *)dangle_dim;
LAB_001251eb:
        local_1a8 = 0;
        in_R9 = (int *)&local_1a8;
        rd_2dim_slice(file_content,&local_1c0,*paiVar9,(int *)in_RCX,in_R8,in_R9);
        goto switchD_00124f6e_caseD_0;
      case INT11:
        paaaiVar10 = int11_37;
        goto LAB_00125225;
      case INT11_H:
        paaaiVar10 = int11_dH;
LAB_00125225:
        uStack_1a0 = 0;
        local_1a8 = 0;
        in_R9 = (int *)&local_1a8;
        piVar11 = int11_dim;
        in_R8 = int11_shift;
        rd_4dim_slice(file_content,&local_1c0,(int *)paaaiVar10,int11_dim,int11_shift,in_R9);
        in_RCX = (char *)piVar11;
        goto switchD_00124f6e_caseD_0;
      case INT21:
        array = int21_37;
        goto LAB_0012527d;
      case INT21_H:
        array = int21_dH;
LAB_0012527d:
        local_198 = 0;
        uStack_1a0 = 0;
        local_1a8 = 0;
        in_R9 = (int *)&local_1a8;
        piVar11 = int21_dim;
        in_R8 = int21_shift;
        rd_5dim_slice(file_content,&local_1c0,(int *)array,int21_dim,int21_shift,in_R9);
        in_RCX = (char *)piVar11;
        goto switchD_00124f6e_caseD_0;
      case INT22:
        paaaaaiVar19 = int22_37;
        goto LAB_001252ad;
      case INT22_H:
        paaaaaiVar19 = int22_dH;
LAB_001252ad:
        rd_6dim_slice(file_content,&local_1c0,(int *)paaaaaiVar19,(int *)in_RCX,in_R8,in_R9);
        update_nst(paaaaaiVar19);
        goto switchD_00124f6e_caseD_0;
      case ML:
        in_R8 = (int *)0x0;
        in_R9 = (int *)0x0;
        rd_1dim_slice(file_content,&local_1c0,(int *)&local_1a8,6,0,0);
        ML_BASE37 = (int)local_1a8;
        ML_BASEdH = local_1a8._4_4_;
        ML_closing37 = (int)uStack_1a0;
        ML_closingdH = uStack_1a0._4_4_;
        ML_intern37 = local_198;
        in_RCX = (char *)&ML_interndH;
        iVar5 = local_194;
        goto LAB_0012562e;
      case TL:
        pcVar16 = Tetraloops;
        memset(Tetraloops,0,0x119);
        piVar11 = Tetraloop37;
        memset(Tetraloop37,0,0xa0);
        piVar13 = TetraloopdH;
        memset(TetraloopdH,0,0xa0);
        local_1b8 = (int (*) [5])(file_content + sVar1);
        uVar21 = 0;
        do {
          uVar23 = uVar21;
          if (*(char **)((long)local_1b8 + uVar23 * 8) == (char *)0x0) break;
          in_R8 = piVar13;
          iVar5 = __isoc99_sscanf(*(char **)((long)local_1b8 + uVar23 * 8),"%6s %d %d",pcVar16,
                                  piVar11);
          sVar7 = strlen(Tetraloops);
          in_RCX = Tetraloops;
          (Tetraloops + sVar7)[0] = ' ';
          (Tetraloops + sVar7)[1] = '\0';
          if (iVar5 != 3) break;
          piVar13 = piVar13 + 1;
          piVar11 = piVar11 + 1;
          pcVar16 = pcVar16 + 7;
          uVar21 = uVar23 + 1;
        } while (uVar23 < 0x27);
        goto LAB_00125564;
      case TRI:
        pcVar16 = Triloops;
        memset(Triloops,0,0xf1);
        piVar11 = Triloop37;
        memset(Triloop37,0,0xa0);
        piVar13 = TriloopdH;
        memset(TriloopdH,0,0xa0);
        local_1b8 = (int (*) [5])(file_content + sVar1);
        uVar21 = 0;
        do {
          uVar23 = uVar21;
          if (*(char **)((long)local_1b8 + uVar23 * 8) == (char *)0x0) break;
          in_R8 = piVar13;
          iVar5 = __isoc99_sscanf(*(char **)((long)local_1b8 + uVar23 * 8),"%5s %d %d",pcVar16,
                                  piVar11);
          sVar7 = strlen(Triloops);
          in_RCX = Triloops;
          (Triloops + sVar7)[0] = ' ';
          (Triloops + sVar7)[1] = '\0';
          if (iVar5 != 3) break;
          piVar13 = piVar13 + 1;
          piVar11 = piVar11 + 1;
          pcVar16 = pcVar16 + 6;
          uVar21 = uVar23 + 1;
        } while (uVar23 < 0x27);
        goto LAB_00125564;
      case HEX:
        pcVar16 = Hexaloops;
        memset(Hexaloops,0,0x169);
        piVar11 = Hexaloop37;
        memset(Hexaloop37,0,0xa0);
        piVar13 = HexaloopdH;
        memset(HexaloopdH,0,0xa0);
        local_1b8 = (int (*) [5])(file_content + sVar1);
        uVar21 = 0;
        do {
          uVar23 = uVar21;
          if (*(char **)((long)local_1b8 + uVar23 * 8) == (char *)0x0) break;
          in_R8 = piVar13;
          iVar5 = __isoc99_sscanf(*(char **)((long)local_1b8 + uVar23 * 8),"%8s %d %d",pcVar16,
                                  piVar11);
          sVar7 = strlen(Hexaloops);
          in_RCX = Hexaloops;
          (Hexaloops + sVar7)[0] = ' ';
          (Hexaloops + sVar7)[1] = '\0';
          if (iVar5 != 3) break;
          piVar13 = piVar13 + 1;
          piVar11 = piVar11 + 1;
          pcVar16 = pcVar16 + 9;
          uVar21 = uVar23 + 1;
        } while (uVar23 < 0x27);
LAB_00125564:
        local_1c0 = sVar1 + uVar23 + 1;
        file_content = (char **)local_1b0;
        goto switchD_00124f6e_caseD_0;
      case NIN:
        in_R8 = (int *)0x0;
        in_R9 = (int *)0x0;
        rd_1dim_slice(file_content,&local_1c0,(int *)&local_1a8,3,0,0);
        ninio37 = (int)local_1a8;
        niniodH = local_1a8._4_4_;
        in_RCX = (char *)&MAX_NINIO;
        iVar5 = (int)uStack_1a0;
        goto LAB_0012562e;
      case MISC:
        in_R8 = (int *)0x0;
        in_R9 = (int *)0x0;
        rd_1dim_slice(file_content,&local_1c0,(int *)&local_1a8,4,0,0);
        DuplexInit37 = (int)local_1a8;
        DuplexInitdH = local_1a8._4_4_;
        TerminalAU37 = (int)uStack_1a0;
        in_RCX = (char *)&TerminalAUdH;
        iVar5 = uStack_1a0._4_4_;
LAB_0012562e:
        *(int *)in_RCX = iVar5;
        goto switchD_00124f6e_caseD_0;
      default:
        vrna_message_warning("read_epars: Unknown field identifier in `%s\'",pcVar16);
        goto switchD_00124f6e_caseD_0;
      }
      local_1a8 = 0;
      in_R9 = (int *)&local_1a8;
      piVar11 = mismatch_dim;
      in_R8 = mismatch_shift;
      rd_3dim_slice(file_content,&local_1c0,(int *)paaiVar8,mismatch_dim,mismatch_shift,in_R9);
      in_RCX = (char *)piVar11;
switchD_00124f6e_caseD_0:
      sVar1 = local_1c0 + 1;
      paaiVar4 = local_1b0;
      paaiVar8 = local_1b0;
      pcVar16 = file_content[local_1c0];
    }
    paiVar20 = stack37;
    paiVar22 = stack37;
    lVar14 = 0;
    local_1b0 = paaiVar8;
    do {
      lVar17 = 0;
      do {
        if (*(int *)((long)*paiVar20 + lVar17) != *(int *)((long)paiVar22 + lVar17 * 2 * 4)) {
          vrna_message_warning("stacking energies not symmetric");
        }
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0x20);
      lVar14 = lVar14 + 1;
      paiVar22 = (int (*) [8])((long)paiVar22 + 4);
      paiVar20 = paiVar20 + 1;
    } while (lVar14 != 8);
    paiVar20 = stackdH;
    paiVar22 = stackdH;
    lVar14 = 0;
    do {
      lVar17 = 0;
      do {
        if (*(int *)((long)*paiVar20 + lVar17) != *(int *)((long)paiVar22 + lVar17 * 2 * 4)) {
          vrna_message_warning("stacking enthalpies not symmetric");
        }
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0x20);
      lVar14 = lVar14 + 1;
      paiVar22 = (int (*) [8])((long)paiVar22 + 4);
      paiVar20 = paiVar20 + 1;
    } while (lVar14 != 8);
    paaaiVar12 = int11_37;
    paaaiVar10 = int11_37;
    uVar21 = 0;
    do {
      uVar23 = 0;
      local_188 = *paaaiVar10;
      local_180 = (int (*) [5])paaaiVar12;
      do {
        uVar15 = 0;
        local_1b0 = *paaaiVar12;
        local_178 = *paaaiVar10;
        do {
          uVar18 = 0;
          local_1b8 = (int (*) [5])paaaiVar10;
          do {
            uVar2 = (*(int (*) [5] [5])*(int (*) [5])paaaiVar12)[0][uVar18];
            uVar3 = (*(int (*) [5] [5])*(int (*) [5])paaaiVar10)[0][0];
            if (uVar2 != uVar3) {
              vrna_message_warning
                        ("int11 energies not symmetric (%d,%d,%d,%d) (%d vs. %d)",
                         uVar21 & 0xffffffff,uVar23 & 0xffffffff,uVar15 & 0xffffffff,
                         uVar18 & 0xffffffff,(ulong)uVar2,uVar3);
            }
            uVar18 = uVar18 + 1;
            paaaiVar10 = (int (*) [8] [5] [5])((long)paaaiVar10 + 0x14);
          } while (uVar18 != 5);
          uVar15 = uVar15 + 1;
          paaaiVar10 = (int (*) [8] [5] [5])(*local_1b8 + 1);
          paaaiVar12 = (int (*) [8] [5] [5])((long)paaaiVar12 + 0x14);
        } while (uVar15 != 5);
        uVar23 = uVar23 + 1;
        paaaiVar10 = (int (*) [8] [5] [5])((long)local_178 + 800);
        paaaiVar12 = (int (*) [8] [5] [5])((long)local_1b0 + 100);
      } while (uVar23 != 8);
      uVar21 = uVar21 + 1;
      paaaiVar10 = (int (*) [8] [5] [5])((long)local_188 + 100);
      paaaiVar12 = (int (*) [8] [5] [5])(local_180 + 0x28);
    } while (uVar21 != 8);
    paaaiVar10 = int11_dH;
    paaaiVar12 = int11_dH;
    local_170 = (int (*) [5])0x0;
    do {
      local_178 = (int (*) [5] [5])0x0;
      local_188 = *paaaiVar12;
      local_180 = (int (*) [5])paaaiVar10;
      do {
        lVar14 = 0;
        local_1b8 = (int (*) [5])paaaiVar10;
        local_1b0 = *paaaiVar12;
        do {
          lVar17 = 0;
          paiVar9 = (int (*) [5])paaaiVar12;
          do {
            if ((*(int (*) [5] [5])*(int (*) [5])paaaiVar10)[0][lVar17] !=
                (*(int (*) [5] [5])*paiVar9)[0][0]) {
              vrna_message_warning("int11 enthalpies not symmetric");
            }
            lVar17 = lVar17 + 1;
            paiVar9 = paiVar9 + 1;
          } while (lVar17 != 5);
          lVar14 = lVar14 + 1;
          paaaiVar12 = (int (*) [8] [5] [5])(*(int (*) [5])paaaiVar12 + 1);
          paaaiVar10 = (int (*) [8] [5] [5])((long)paaaiVar10 + 0x14);
        } while (lVar14 != 5);
        local_178 = (int (*) [5] [5])((long)local_178 + 1);
        paaaiVar12 = (int (*) [8] [5] [5])((long)local_1b0 + 800);
        paaaiVar10 = (int (*) [8] [5] [5])(local_1b8 + 5);
      } while (local_178 != (int (*) [5] [5])0x8);
      local_170 = (int (*) [5])((long)local_170 + 1);
      paaaiVar12 = (int (*) [8] [5] [5])((long)local_188 + 100);
      paaaiVar10 = (int (*) [8] [5] [5])(local_180 + 0x28);
    } while (local_170 != (int (*) [5])0x8);
    paaaaaiVar19 = int22_37;
    paaaaaiVar24 = int22_37;
    lVar14 = 0;
    do {
      local_158 = (int (*) [5] [5])0x0;
      local_168 = (int (*) [5] [5])paaaaaiVar24;
      local_160 = (int (*) [5])paaaaaiVar19;
      local_140 = lVar14;
      do {
        local_170 = (int (*) [5])0x0;
        local_150 = (int (*) [5] [5])paaaaaiVar24;
        local_148 = (int (*) [5] [5])paaaaaiVar19;
        do {
          local_178 = (int (*) [5] [5])0x0;
          local_188 = (int (*) [5] [5])paaaaaiVar24;
          local_180 = (int (*) [5])paaaaaiVar19;
          do {
            lVar14 = 0;
            local_1b8 = (int (*) [5])paaaaaiVar19;
            local_1b0 = (int (*) [5] [5])paaaaaiVar24;
            do {
              lVar17 = 0;
              paaiVar8 = (int (*) [5] [5])paaaaaiVar24;
              do {
                if ((*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaaiVar19)[0][0][0][lVar17] !=
                    (*(int (*) [5] [5] [5] [5])*paaiVar8)[0][0][0][0]) {
                  vrna_message_warning("int22 energies not symmetric");
                }
                lVar17 = lVar17 + 1;
                paaiVar8 = paaiVar8 + 1;
              } while (lVar17 != 5);
              lVar14 = lVar14 + 1;
              paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar24 + 500);
              paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar19 + 0x14);
            } while (lVar14 != 5);
            local_178 = (int (*) [5] [5])((long)local_178 + 1);
            paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])((*local_1b0)[0] + 1);
            paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])(local_1b8 + 5);
          } while (local_178 != (int (*) [5] [5])0x5);
          local_170 = (int (*) [5])((long)local_170 + 1);
          paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])(*local_188 + 1);
          paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])(local_180 + 0x19);
        } while (local_170 != (int (*) [5])0x5);
        local_158 = (int (*) [5] [5])((long)local_158 + 1);
        paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])(local_150 + 200);
        paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])((long)local_148 + 0x9c4);
      } while (local_158 != (int (*) [5] [5])0x8);
      lVar14 = local_140 + 1;
      paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])(local_168 + 0x19);
      paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])(local_160 + 1000);
    } while (lVar14 != 8);
    paaaaaiVar19 = int22_dH;
    paaaaaiVar24 = int22_dH;
    local_1b0 = (int (*) [5] [5])0x0;
    do {
      local_1b8 = (int (*) [5])0x0;
      local_168 = (int (*) [5] [5])paaaaaiVar24;
      local_160 = (int (*) [5])paaaaaiVar19;
      do {
        uVar21 = 0;
        local_158 = (int (*) [5] [5])paaaaaiVar24;
        local_150 = (int (*) [5] [5])paaaaaiVar19;
        do {
          uVar23 = 0;
          local_170 = (int (*) [5])paaaaaiVar19;
          local_148 = (int (*) [5] [5])paaaaaiVar24;
          do {
            uVar15 = 0;
            local_188 = (int (*) [5] [5])paaaaaiVar24;
            local_180 = (int (*) [5])paaaaaiVar19;
            do {
              lVar14 = 0;
              local_178 = (int (*) [5] [5])paaaaaiVar24;
              do {
                if ((*(int (*) [5] [5] [5] [5])*(int (*) [5])paaaaaiVar19)[0][0][0][lVar14] !=
                    (*(int (*) [5] [5] [5] [5])*(int (*) [5] [5])paaaaaiVar24)[0][0][0][0]) {
                  vrna_message_warning
                            ("int22 enthalpies not symmetric: %d %d %d %d %d %d",local_1b0,local_1b8
                             ,uVar21 & 0xffffffff,uVar23 & 0xffffffff,uVar15 & 0xffffffff,
                             (int)lVar14);
                }
                lVar14 = lVar14 + 1;
                paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar24 + 100);
              } while (lVar14 != 5);
              uVar15 = uVar15 + 1;
              paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])(local_178 + 5);
              paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])((long)paaaaaiVar19 + 0x14);
            } while (uVar15 != 5);
            uVar23 = uVar23 + 1;
            paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])((*local_188)[0] + 1);
            paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])(local_180 + 5);
          } while (uVar23 != 5);
          uVar21 = uVar21 + 1;
          paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])(*local_148 + 1);
          paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])(local_170 + 0x19);
        } while (uVar21 != 5);
        local_1b8 = (int (*) [5])((long)local_1b8 + 1);
        paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])(local_158 + 200);
        paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])((long)local_150 + 0x9c4);
      } while (local_1b8 != (int (*) [5])0x8);
      local_1b0 = (int (*) [5] [5])((long)local_1b0 + 1);
      paaaaaiVar24 = (int (*) [8] [5] [5] [5] [5])(local_168 + 0x19);
      paaaaaiVar19 = (int (*) [8] [5] [5] [5] [5])(local_160 + 1000);
    } while (local_1b0 != (int (*) [5] [5])0x8);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

PRIVATE int
set_parameters_from_string(char       **file_content,
                           const char *name)
{
  size_t      line_no;
  char        *line, ident[256];
  enum parset type;
  int         r;

  line_no = 0;

  if ((!file_content) ||
      (!file_content[line_no]))
    return 0;

  /* store file name of parameter data set */
  free(last_param_file);
  last_param_file = (name) ? strdup(name) : NULL;
  // free(last_param_file);

  if (strncmp(file_content[line_no++], "## RNAfold parameter file v2.0", 30) != 0) {
    vrna_message_warning("Missing header line in file.\n"
                         "May be this file has not v2.0 format.\n"
                         "Use INTERRUPT-key to stop.");
  }

  while ((line = file_content[line_no++])) {
    r = sscanf(line, "# %255s", ident);
    if (r == 1) {
      type = gettype(ident);
      switch (type) {
        case QUIT:
          break;
        case S:
          rd_2dim(file_content, &line_no, &(stack37[0][0]), stack_dim, stack_shift);
          break;
        case S_H:
          rd_2dim(file_content, &line_no, &(stackdH[0][0]), stack_dim, stack_shift);
          break;
        case HP:
          rd_1dim(file_content, &line_no, &(hairpin37[0]), 31, 0);
          break;
        case HP_H:
          rd_1dim(file_content, &line_no, &(hairpindH[0]), 31, 0);
          break;
        case B:
          rd_1dim(file_content, &line_no, &(bulge37[0]), 31, 0);
          break;
        case B_H:
          rd_1dim(file_content, &line_no, &(bulgedH[0]), 31, 0);
          break;
        case IL:
          rd_1dim(file_content, &line_no, &(internal_loop37[0]), 31, 0);
          break;
        case IL_H:
          rd_1dim(file_content, &line_no, &(internal_loopdH[0]), 31, 0);
          break;
        case MME:
          rd_3dim(file_content, &line_no, &(mismatchExt37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MME_H:
          rd_3dim(file_content, &line_no, &(mismatchExtdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMH:
          rd_3dim(file_content, &line_no, &(mismatchH37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMH_H:
          rd_3dim(file_content, &line_no, &(mismatchHdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI:
          rd_3dim(file_content, &line_no, &(mismatchI37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI_H:
          rd_3dim(file_content, &line_no, &(mismatchIdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N:
          rd_3dim(file_content, &line_no, &(mismatch1nI37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI1N_H:
          rd_3dim(file_content, &line_no, &(mismatch1nIdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23:
          rd_3dim(file_content, &line_no, &(mismatch23I37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMI23_H:
          rd_3dim(file_content, &line_no, &(mismatch23IdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMM:
          rd_3dim(file_content, &line_no, &(mismatchM37[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case MMM_H:
          rd_3dim(file_content, &line_no, &(mismatchMdH[0][0][0]),
                  mismatch_dim,
                  mismatch_shift);
          break;
        case INT11:
          rd_4dim(file_content, &line_no, &(int11_37[0][0][0][0]),
                  int11_dim,
                  int11_shift);
          break;
        case INT11_H:
          rd_4dim(file_content, &line_no, &(int11_dH[0][0][0][0]),
                  int11_dim,
                  int11_shift);
          break;
        case INT21:
          rd_5dim(file_content, &line_no, &(int21_37[0][0][0][0][0]),
                  int21_dim,
                  int21_shift);
          break;
        case INT21_H:
          rd_5dim(file_content, &line_no, &(int21_dH[0][0][0][0][0]),
                  int21_dim,
                  int21_shift);
          break;
        case INT22:
          rd_6dim_slice(file_content, &line_no, &(int22_37[0][0][0][0][0][0]),
                        int22_dim,
                        int22_shift,
                        int22_post);
          update_nst(int22_37);
          break;
        case INT22_H:
          rd_6dim_slice(file_content, &line_no, &(int22_dH[0][0][0][0][0][0]),
                        int22_dim,
                        int22_shift,
                        int22_post);
          update_nst(int22_dH);
          break;
        case D5:
          rd_2dim(file_content, &line_no, &(dangle5_37[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D5_H:
          rd_2dim(file_content, &line_no, &(dangle5_dH[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D3:
          rd_2dim(file_content, &line_no, &(dangle3_37[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case D3_H:
          rd_2dim(file_content, &line_no, &(dangle3_dH[0][0]),
                  dangle_dim,
                  dangle_shift);
          break;
        case ML:
        {
          int values[6];
          rd_1dim(file_content, &line_no, &values[0], 6, 0);
          ML_BASE37     = values[0];
          ML_BASEdH     = values[1];
          ML_closing37  = values[2];
          ML_closingdH  = values[3];
          ML_intern37   = values[4];
          ML_interndH   = values[5];
        }
        break;
        case NIN:
        {
          int values[3];
          rd_1dim(file_content, &line_no, &values[0], 3, 0);
          ninio37   = values[0];
          niniodH   = values[1];
          MAX_NINIO = values[2];
        }
        break;
        case MISC:
        {
          int values[4];
          rd_1dim(file_content, &line_no, &values[0], 4, 0);
          DuplexInit37  = values[0];
          DuplexInitdH  = values[1];
          TerminalAU37  = values[2];
          TerminalAUdH  = values[3];
        }
        break;
        case TL:
          rd_Tetraloop37(file_content, &line_no);
          break;
        case TRI:
          rd_Triloop37(file_content, &line_no);
          break;
        case HEX:
          rd_Hexaloop37(file_content, &line_no);
          break;
        default:      /* do nothing but complain */
          vrna_message_warning("read_epars: Unknown field identifier in `%s'", line);
      }
    } /* else ignore line */
  }

  check_symmetry();
  return 1;
}